

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadSmt.c
# Opt level: O2

void Smt_PrsReadLines(Smt_Prs_t *p)

{
  Vec_Int_t *p_00;
  Vec_Wec_t *p_01;
  byte bVar1;
  bool bVar2;
  int iVar3;
  int i;
  uint uVar4;
  uint uVar5;
  Vec_Int_t *pVVar6;
  byte *pLim;
  byte *pStr;
  
  if ((p->vStack).nSize != 0) {
    __assert_fail("Vec_IntSize(&p->vStack) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcReadSmt.c"
                  ,0x674,"void Smt_PrsReadLines(Smt_Prs_t *)");
  }
  if ((p->vObjs).nSize != 0) {
    __assert_fail("Vec_WecSize(&p->vObjs) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcReadSmt.c"
                  ,0x676,"void Smt_PrsReadLines(Smt_Prs_t *)");
  }
  p_00 = &p->vStack;
  p_01 = &p->vObjs;
  Vec_IntPush(p_00,0);
  Vec_WecPushLevel(p_01);
  pStr = (byte *)p->pBuffer;
  bVar2 = true;
  do {
    p->pCur = (char *)pStr;
    if (p->pLimit <= pStr) {
      if ((p->vStack).nSize != 1) {
        __assert_fail("Vec_IntSize(&p->vStack) == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcReadSmt.c"
                      ,0x6b1,"void Smt_PrsReadLines(Smt_Prs_t *)");
      }
      uVar5 = (p->vObjs).nSize;
      if (uVar5 == (p->vObjs).nCap) {
        if (1 < uVar5) {
          uVar4 = uVar5 - 1;
          uVar5 = 0;
          for (; uVar4 != 0; uVar4 = uVar4 >> 4) {
            uVar5 = uVar5 + 1;
          }
        }
        p->nDigits = uVar5;
        return;
      }
      __assert_fail("Vec_WecSize(&p->vObjs) == Vec_WecCap(&p->vObjs)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcReadSmt.c"
                    ,0x6b2,"void Smt_PrsReadLines(Smt_Prs_t *)");
    }
    while( true ) {
      bVar1 = *pStr;
      if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) break;
      pStr = pStr + 1;
      p->pCur = (char *)pStr;
    }
    if ((bVar2) && (bVar1 == 0x7c)) {
      while( true ) {
        *pStr = 0x20;
        pStr = (byte *)p->pCur;
        if (*pStr == 0) break;
        if (*pStr == 0x7c) {
          *pStr = 0x20;
          break;
        }
        p->pCur = (char *)(pStr + 1);
      }
      bVar2 = false;
    }
    else if (bVar1 == 0x28) {
      iVar3 = Vec_IntEntryLast(p_00);
      pVVar6 = Vec_WecEntry(p_01,iVar3);
      iVar3 = Abc_Var2Lit((p->vObjs).nSize,0);
      Vec_IntPush(pVVar6,iVar3);
      Vec_IntPush(p_00,(p->vObjs).nSize);
      Vec_WecPushLevel(p_01);
    }
    else {
      pLim = pStr;
      if (bVar1 == 0x29) {
        Vec_IntPop(p_00);
      }
      else {
        while (pLim < p->pLimit) {
          if (((ulong)*pLim < 0x2a) && ((0x30100002600U >> ((ulong)*pLim & 0x3f) & 1) != 0)) {
            p->pCur = (char *)(pLim + -1);
            iVar3 = Abc_NamStrFindOrAddLim(p->pStrs,(char *)pStr,(char *)pLim,(int *)0x0);
            i = Vec_IntEntryLast(p_00);
            pVVar6 = Vec_WecEntry(p_01,i);
            iVar3 = Abc_Var2Lit(iVar3,1);
            Vec_IntPush(pVVar6,iVar3);
            break;
          }
          pLim = pLim + 1;
          p->pCur = (char *)pLim;
        }
      }
    }
    pStr = (byte *)(p->pCur + 1);
  } while( true );
}

Assistant:

void Smt_PrsReadLines( Smt_Prs_t * p )
{
    int fFirstTime = 1;
    assert( Vec_IntSize(&p->vStack) == 0 );
    //assert( Vec_WecSize(&p->vDepth) == 0 );
    assert( Vec_WecSize(&p->vObjs) == 0 );
    // add top node at level 0
    //Vec_WecPushLevel( &p->vDepth );
    //Vec_WecPush( &p->vDepth, Vec_IntSize(&p->vStack), Vec_WecSize(&p->vObjs) );
    // add top node
    Vec_IntPush( &p->vStack, Vec_WecSize(&p->vObjs) );
    Vec_WecPushLevel( &p->vObjs );
    // add other nodes
    for ( p->pCur = p->pBuffer; p->pCur < p->pLimit; p->pCur++ )
    {
        Smt_PrsSkipSpaces( p );
        if ( fFirstTime && *p->pCur == '|' )
        {
            fFirstTime = 0;
            *p->pCur = ' ';
            while ( *p->pCur && *p->pCur != '|' )
                *p->pCur++ = ' ';
            if ( *p->pCur == '|' )
                *p->pCur = ' ';
            continue;
        }
        if ( *p->pCur == '(' )
        {
            // add new node at this depth
            //assert( Vec_WecSize(&p->vDepth) >= Vec_IntSize(&p->vStack) );
            //if ( Vec_WecSize(&p->vDepth) == Vec_IntSize(&p->vStack) )
            //    Vec_WecPushLevel(&p->vDepth);
            //Vec_WecPush( &p->vDepth, Vec_IntSize(&p->vStack), Vec_WecSize(&p->vObjs) );
            // add fanin to node on the previous level
            Vec_IntPush( Vec_WecEntry(&p->vObjs, Vec_IntEntryLast(&p->vStack)), Abc_Var2Lit(Vec_WecSize(&p->vObjs), 0) );            
            // add node to the stack
            Vec_IntPush( &p->vStack, Vec_WecSize(&p->vObjs) );
            Vec_WecPushLevel( &p->vObjs );
        }
        else if ( *p->pCur == ')' )
        {
            Vec_IntPop( &p->vStack );
        }
        else  // token
        {
            char * pStart = p->pCur; 
            Smt_PrsSkipNonSpaces( p );
            if ( p->pCur < p->pLimit )
            {
                // remove strange characters (this can lead to name clashes)
                int iToken;
                /* commented out for SMT comp
                char * pTemp;
                if ( *pStart == '?' )
                    *pStart = '_';
                for ( pTemp = pStart; pTemp < p->pCur; pTemp++ )
                    if ( *pTemp == '.' )
                        *pTemp = '_';*/
                // create and save token for this string
                iToken = Abc_NamStrFindOrAddLim( p->pStrs, pStart, p->pCur--, NULL );
                Vec_IntPush( Vec_WecEntry(&p->vObjs, Vec_IntEntryLast(&p->vStack)), Abc_Var2Lit(iToken, 1) );
            }
        }
    }
    assert( Vec_IntSize(&p->vStack) == 1 );
    assert( Vec_WecSize(&p->vObjs) == Vec_WecCap(&p->vObjs) );
    p->nDigits = Abc_Base16Log( Vec_WecSize(&p->vObjs) );
}